

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_font.cpp
# Opt level: O1

bool ON_Font::TestInstalledFontList(ON_TextLog *text_log)

{
  int iVar1;
  ON_FontListImpl *pOVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  ON_SHA1_Hash *pOVar6;
  ON_Font *pOVar7;
  ON_ClassArray<ON_FontFaceQuartet> *pOVar8;
  wchar_t *pwVar9;
  ON_Font *pOVar10;
  ulong uVar11;
  wchar_t *pwVar12;
  ON_FontFaceQuartet *src;
  char *format;
  uint i;
  ulong uVar13;
  long lVar14;
  ON_wString *this;
  bool bVar15;
  ON_wString qname1;
  ON_wString qname;
  ON_TextLogIndent indent2;
  ON_TextLogIndent indent1;
  ON_TextLogIndent indent1_1;
  ON_Font *f1 [4];
  int local_174;
  ON_wString local_168;
  ON_wString local_160;
  undefined1 local_158 [16];
  ON_Font *local_148;
  ON_Font *local_140;
  ON_ClassArray<ON_FontFaceQuartet> *local_130;
  ulong local_128;
  ON_FontList *local_120;
  ulong local_118;
  ON_FontFaceQuartet local_110;
  ON_wString local_e8 [4];
  undefined8 local_c8;
  undefined8 uStack_c0;
  undefined4 local_b8;
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined4 local_98;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined4 local_78;
  ON_TextLogIndent local_68;
  ON_wString local_58;
  ON_Font *pOStack_50;
  ON_Font *local_48;
  ON_Font *pOStack_40;
  
  ON_ManagedFonts::InstalledFonts();
  iVar1 = ON_ManagedFonts::List.m_installed_fonts.m_by_index.m_count;
  uVar11 = (ulong)(uint)ON_ManagedFonts::List.m_installed_fonts.m_by_index.m_count;
  if (uVar11 == 0) {
    format = "ERROR: 0 = ON_Font::InstalledFontList().Count()\n";
  }
  else {
    ON_FontList::Internal_UpdateSortedLists(&ON_ManagedFonts::List.m_installed_fonts);
    pOVar2 = ON_ManagedFonts::List.m_installed_fonts.m_sorted;
    if (iVar1 == ((ON_ManagedFonts::List.m_installed_fonts.m_sorted)->m_by_font_characteristics_hash
                 ).m_count) {
      ON_TextLog::Print(text_log,"Testing %u installed fonts:\n",(ulong)(uint)iVar1);
      ON_TextLogIndent::ON_TextLogIndent((ON_TextLogIndent *)&local_110,text_log);
      ON_TextLog::Print(text_log,L"FromFontCharacteristicsHash() tests ...");
      ON_TextLogIndent::ON_TextLogIndent((ON_TextLogIndent *)local_158,text_log);
      uVar13 = 0;
      do {
        pOVar6 = FontCharacteristicsHash((pOVar2->m_by_font_characteristics_hash).m_a[uVar13]);
        local_88 = *(undefined8 *)pOVar6->m_digest;
        uStack_80 = *(undefined8 *)(pOVar6->m_digest + 8);
        local_78 = *(undefined4 *)(pOVar6->m_digest + 0x10);
        ON_FontList::FromFontCharacteristicsHash
                  (&ON_ManagedFonts::List.m_installed_fonts,(ON_SHA1_Hash)*&pOVar6->m_digest,false);
        uVar13 = uVar13 + 1;
      } while (uVar11 != uVar13);
      ON_TextLog::Print(text_log," passed.\n");
      ON_TextLogIndent::~ON_TextLogIndent((ON_TextLogIndent *)local_158);
      pOVar6 = FontCharacteristicsHash(&Default);
      local_98 = *(undefined4 *)(pOVar6->m_digest + 0x10);
      local_a8 = *(undefined8 *)pOVar6->m_digest;
      uStack_a0 = *(undefined8 *)(pOVar6->m_digest + 8);
      pOVar7 = ON_FontList::FromFontCharacteristicsHash
                         (&ON_ManagedFonts::List.m_installed_fonts,(ON_SHA1_Hash)*&pOVar6->m_digest,
                          false);
      bVar15 = pOVar7 != (ON_Font *)0x0;
      if (!bVar15) {
        ON_TextLog::Print(text_log,
                          "ERROR: nullptr = ON_Font::InstalledFontList()..FromFontCharacteristicsHash(ON_Font::Default.FontCharacteristicsHash(),false)\n"
                         );
      }
      ON_TextLogIndent::~ON_TextLogIndent((ON_TextLogIndent *)&local_110);
      local_120 = &ON_ManagedFonts::List.m_installed_fonts;
      pOVar8 = ON_FontList::QuartetList(&ON_ManagedFonts::List.m_installed_fonts);
      uVar11 = (ulong)(uint)pOVar8->m_count;
      ON_TextLog::Print(text_log,"Testing %u quartets:\n",uVar11);
      ON_TextLogIndent::ON_TextLogIndent(&local_68,text_log);
      local_118 = uVar11;
      if (uVar11 == 0) {
        local_174 = 0;
      }
      else {
        uVar11 = 0;
        local_174 = 0;
        local_130 = pOVar8;
        do {
          src = pOVar8->m_a + uVar11;
          local_128 = uVar11;
          ON_wString::ON_wString(&local_160,&src->m_quartet_name);
          bVar3 = ON_wString::IsEmpty(&local_160);
          if (bVar3) {
            ON_TextLog::Print(text_log,"ERROR: nullptr = quartet_list[%u].QuartetName() is empty\n",
                              local_128);
            local_174 = local_174 + 1;
            bVar15 = false;
          }
          else {
            pwVar9 = ON_wString::operator_cast_to_wchar_t_(&local_160);
            ON_FontList::QuartetFromQuartetName(&local_110,local_120,pwVar9);
            ON_wString::ON_wString((ON_wString *)local_158,&src->m_quartet_name);
            ON_wString::ON_wString(&local_58,&local_110.m_quartet_name);
            bVar3 = ::operator==((ON_wString *)local_158,&local_58);
            ON_wString::~ON_wString(&local_58);
            ON_wString::~ON_wString((ON_wString *)local_158);
            local_158._0_8_ = src->m_regular;
            local_158._8_8_ = src->m_bold;
            local_148 = src->m_italic;
            local_140 = src->m_bold_italic;
            local_58.m_s = (wchar_t *)local_110.m_regular;
            pOStack_50 = local_110.m_bold;
            local_48 = local_110.m_italic;
            pOStack_40 = local_110.m_bold_italic;
            this = local_e8;
            ON_wString::ON_wString(this,L"regular");
            ON_wString::ON_wString(local_e8 + 1,L"bold");
            ON_wString::ON_wString(local_e8 + 2,L"italic");
            ON_wString::ON_wString(local_e8 + 3,L"bolditalic");
            lVar14 = 0;
            do {
              if ((bVar3 != false) &&
                 (*(wchar_t **)(local_158 + lVar14 * 8) != (&local_58)[lVar14].m_s)) {
                bVar3 = false;
              }
              pOVar7 = *(ON_Font **)(local_158 + lVar14 * 8);
              if (pOVar7 != (ON_Font *)0x0) {
                ON_wString::ON_wString(&local_168,&local_160);
                ON_wString::operator+=(&local_168,L" (");
                ON_wString::operator+=(&local_168,this);
                ON_wString::operator+=(&local_168,L")");
                pOVar6 = FontCharacteristicsHash(pOVar7);
                local_c8 = *(undefined8 *)pOVar6->m_digest;
                uStack_c0 = *(undefined8 *)(pOVar6->m_digest + 8);
                local_b8 = *(undefined4 *)(pOVar6->m_digest + 0x10);
                pOVar10 = ON_FontList::FromFontCharacteristicsHash
                                    (local_120,(ON_SHA1_Hash)*&pOVar6->m_digest,false);
                if (pOVar10 != pOVar7) {
                  pwVar9 = ON_wString::Array(&local_168);
                  bVar15 = false;
                  ON_TextLog::Print(text_log,
                                    "ERROR: nullptr = ON_Font::InstalledFontList().FromFontCharacteristicsHash(%ls,false).\n"
                                    ,pwVar9);
                  local_174 = local_174 + 1;
                }
                bVar4 = IsBoldInQuartet(pOVar7);
                bVar5 = IsItalicInQuartet(pOVar7);
                if ((bool)(&DAT_006c8f8c)[lVar14] != bVar4) {
                  pwVar9 = ON_wString::Array(&local_168);
                  pwVar12 = L"false";
                  if (bVar4) {
                    pwVar12 = L"true";
                  }
                  bVar15 = false;
                  ON_TextLog::Print(text_log,"ERROR: IsBoldInQuartet(%ls) = %ls.\n",pwVar9,pwVar12);
                  local_174 = local_174 + 1;
                }
                if ((bool)(&DAT_006c8f90)[lVar14] != bVar5) {
                  pwVar9 = ON_wString::Array(&local_168);
                  pwVar12 = L"false";
                  if (bVar5) {
                    pwVar12 = L"true";
                  }
                  bVar15 = false;
                  ON_TextLog::Print(text_log,"ERROR: IsItalicInQuartet(%ls) = %ls.\n",pwVar9,pwVar12
                                   );
                  local_174 = local_174 + 1;
                }
                ON_wString::~ON_wString(&local_168);
              }
              lVar14 = lVar14 + 1;
              this = this + 1;
            } while (lVar14 != 4);
            pOVar8 = local_130;
            if (bVar3 == false) {
              pwVar9 = ON_wString::operator_cast_to_wchar_t_(&local_160);
              pOVar8 = local_130;
              ON_TextLog::Print(text_log,L"ERROR: QuartetFromQuartetName(%ls) failed.\n",pwVar9);
              local_174 = local_174 + 1;
            }
            lVar14 = 0x18;
            do {
              ON_wString::~ON_wString((ON_wString *)((long)&local_e8[0].m_s + lVar14));
              lVar14 = lVar14 + -8;
            } while (lVar14 != -8);
            ON_wString::~ON_wString(&local_110.m_quartet_name);
          }
          ON_wString::~ON_wString(&local_160);
          uVar11 = local_128 + 1;
        } while (uVar11 != local_118);
      }
      if (local_174 == 0) {
        ON_TextLog::Print(text_log,"Passed.\n");
      }
      else {
        ON_TextLog::Print(text_log,"FAILED. %u quartet errors.\n");
      }
      ON_TextLogIndent::~ON_TextLogIndent(&local_68);
      return bVar15;
    }
    format = 
    "ERROR: nullptr = ON_Font::InstalledFontList()..FromFontCharacteristicsHash(ON_Font::Default.FontCharacteristicsHash(),false)\n"
    ;
  }
  ON_TextLog::Print(text_log,format);
  return false;
}

Assistant:

bool ON_Font::TestInstalledFontList(ON_TextLog& text_log)
{
  const class ON_FontList& font_list = ON_Font::InstalledFontList();
  const unsigned font_count = font_list.Count();
  if (font_count <= 0)
  {
    text_log.Print("ERROR: 0 = ON_Font::InstalledFontList().Count()\n");
    return Internal_TestInstalledFontsFailure();
  }

  const ON_SimpleArray< const class ON_Font* >& by_hash = font_list.ByFontCharacteristicsHash();
  if (font_count != by_hash.UnsignedCount())
  {
    text_log.Print("ERROR: nullptr = ON_Font::InstalledFontList()..FromFontCharacteristicsHash(ON_Font::Default.FontCharacteristicsHash(),false)\n");
    return Internal_TestInstalledFontsFailure();
  }

  const bool bReturnFirst = false;
  bool bPassedTest = true;

  text_log.Print("Testing %u installed fonts:\n", font_count);
  {
    const ON_TextLogIndent indent1(text_log);


    text_log.Print(L"FromFontCharacteristicsHash() tests ...");
    {
      ON_TextLogIndent indent2(text_log);
      unsigned error_count = 0;
      for (unsigned i = 0; i < font_count; ++i)
      {
        const ON_Font* f = by_hash[i];
        const ON_SHA1_Hash h = f->FontCharacteristicsHash();

        const ON_Font* f1 = f = font_list.FromFontCharacteristicsHash(h, bReturnFirst);
        if (f != f1)
        {
          if (0 == error_count)
            text_log.PrintNewLine();
          ++error_count;
          text_log.Print("ERROR: nullptr = ON_Font::InstalledFontList().FromFontCharacteristicsHash(by_hash[%u],false).\n", i);
          bPassedTest = false;
        }
      }
      if (error_count > 0)
        text_log.Print("FAILED. %u errors.\n", error_count);
      else
        text_log.Print(" passed.\n");
    }

    {
      const ON_Font* f = font_list.FromFontCharacteristicsHash(ON_Font::Default.FontCharacteristicsHash(), bReturnFirst);
      if (nullptr == f)
      {
        text_log.Print("ERROR: nullptr = ON_Font::InstalledFontList()..FromFontCharacteristicsHash(ON_Font::Default.FontCharacteristicsHash(),false)\n");
        bPassedTest = false;
      }
    }
  }

  const ON_ClassArray< ON_FontFaceQuartet >& quartet_list = font_list.QuartetList();
  const unsigned quartet_count = quartet_list.UnsignedCount();
  text_log.Print("Testing %u quartets:\n", quartet_count);
  {
    const ON_TextLogIndent indent1(text_log);

    unsigned error_count = 0;
    for (unsigned i = 0; i < quartet_count; ++i)
    {
      const ON_FontFaceQuartet& q = quartet_list[i];
      const ON_wString qname = q.QuartetName();
      if (qname.IsEmpty())
      {
        ++error_count;
        text_log.Print("ERROR: nullptr = quartet_list[%u].QuartetName() is empty\n", i);
        bPassedTest = false;
        continue;
      }
      const ON_FontFaceQuartet q1 = font_list.QuartetFromQuartetName(qname);
      bool bQuartetFromQuartetNamePass = q.QuartetName() == q1.QuartetName();
      const ON_Font* f[4] = { q.RegularFace(),q.BoldFace(),q.ItalicFace(),q.BoldItalicFace() };
      const ON_Font* f1[4] = { q1.RegularFace(),q1.BoldFace(),q1.ItalicFace(),q1.BoldItalicFace() };
      const bool bExpectedIsBoldInQuartet[4] = { false,true,false,true };
      const bool bExpectedIsItalicInQuartet[4] = { false,false,true,true };
      const ON_wString qface[4] = { ON_wString(L"regular"), ON_wString(L"bold"), ON_wString(L"italic"), ON_wString(L"bolditalic") };
      for (unsigned k = 0; k < 4; ++k)
      {
        if (bQuartetFromQuartetNamePass && f[k] != f1[k])
          bQuartetFromQuartetNamePass = false;
        if (nullptr != f[k])
        {
          ON_wString qname1 = qname;
          qname1 += L" (";
          qname1 += qface[k];
          qname1 += L")";
          const ON_SHA1_Hash h = f[k]->FontCharacteristicsHash();
          const ON_Font* f2 = font_list.FromFontCharacteristicsHash(h, bReturnFirst);
          if (f2 != f[k])
          {
            ++error_count;
            text_log.Print("ERROR: nullptr = ON_Font::InstalledFontList().FromFontCharacteristicsHash(%ls,false).\n", qname1.Array());
            bPassedTest = false;
          }
          const bool bIsBoldInQuartet = f[k]->IsBoldInQuartet();
          const bool bIsItalicInQuartet = f[k]->IsItalicInQuartet();
          if (bIsBoldInQuartet != bExpectedIsBoldInQuartet[k])
          {
            ++error_count;
            text_log.Print("ERROR: IsBoldInQuartet(%ls) = %ls.\n", qname1.Array(), bIsBoldInQuartet?L"true":L"false");
            bPassedTest = false;
          }
          if (bIsItalicInQuartet != bExpectedIsItalicInQuartet[k])
          {
            ++error_count;
            text_log.Print("ERROR: IsItalicInQuartet(%ls) = %ls.\n", qname1.Array(), bIsItalicInQuartet ? L"true" : L"false");
            bPassedTest = false;
          }
        }
      }
      if (false == bQuartetFromQuartetNamePass)
      {
        ++error_count;
        text_log.Print(L"ERROR: QuartetFromQuartetName(%ls) failed.\n",static_cast<const wchar_t*>(qname));
      }
    }
    if (error_count > 0)
      text_log.Print("FAILED. %u quartet errors.\n", error_count);
    else
      text_log.Print("Passed.\n");
  }

  return bPassedTest;
}